

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmime_list.c
# Opt level: O2

void * cmime_list_pop_head(CMimeList_T *list)

{
  int iVar1;
  void *local_10;
  void *data;
  
  if (list == (CMimeList_T *)0x0) {
    __assert_fail("list",
                  "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/src/cmime_list.c"
                  ,0x75,"void *cmime_list_pop_head(CMimeList_T *)");
  }
  iVar1 = cmime_list_remove(list,list->head,&local_10);
  if (iVar1 != 0) {
    local_10 = (void *)0x0;
  }
  return local_10;
}

Assistant:

void *cmime_list_pop_head(CMimeList_T *list) {
    void *data;
    int ret;
 
    assert(list);
    
    ret = cmime_list_remove(list,cmime_list_head(list),&data);
 
    if(ret == 0) {
        return(data);
    } else {
        return(NULL);
    }
}